

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

Pass * wasm::createPoppifyPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x30);
  PoppifyPass::PoppifyPass((PoppifyPass *)this);
  return this;
}

Assistant:

Pass* createPoppifyPass() { return new PoppifyPass; }